

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aalcalc.cpp
# Opt level: O2

void __thiscall aalcalc::fillensemblerec(aalcalc *this,int sidx,double mean,double weighting)

{
  double *pdVar1;
  double *pdVar2;
  int iVar3;
  pointer paVar4;
  double dVar5;
  int iVar6;
  
  iVar3 = (this->sidxtoensemble_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[sidx];
  iVar6 = (this->current_summary_id_ + -1) * this->max_ensemble_id_ + iVar3;
  paVar4 = (this->vec_ensemble_aal_).
           super__Vector_base<aal_rec_ensemble,_std::allocator<aal_rec_ensemble>_>._M_impl.
           super__Vector_impl_data._M_start;
  paVar4[iVar6].super_aal_rec.summary_id = this->current_summary_id_;
  paVar4[iVar6].super_aal_rec.type = 2;
  paVar4[iVar6].ensemble_id = iVar3;
  pdVar1 = &paVar4[iVar6].super_aal_rec.mean;
  dVar5 = pdVar1[1];
  pdVar2 = &paVar4[iVar6].super_aal_rec.mean;
  *pdVar2 = weighting * mean + *pdVar1;
  pdVar2[1] = weighting * mean * mean + dVar5;
  return;
}

Assistant:

inline void aalcalc::fillensemblerec(const int sidx, const double mean,
				     const double weighting)
{
	int current_ensemble_id = sidxtoensemble_[sidx];
	aal_rec_ensemble& ea = vec_ensemble_aal_[max_ensemble_id_ * (current_summary_id_ - 1) + current_ensemble_id];
	ea.summary_id = current_summary_id_;
	ea.type = 2;
	ea.ensemble_id = current_ensemble_id;
	ea.mean += mean * weighting;
	ea.mean_squared += mean * mean * weighting;
}